

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderControlStatementTests.cpp
# Opt level: O0

void __thiscall deqp::gles3::Performance::ConditionalCase::deinit(ConditionalCase *this)

{
  int iVar1;
  undefined4 extraout_var;
  Functions *gl;
  ConditionalCase *this_local;
  
  iVar1 = (*((this->super_ControlStatementCase).super_ShaderPerformanceCase.m_renderCtx)->
            _vptr_RenderContext[3])();
  std::vector<float,_std::allocator<float>_>::clear(&this->m_comparisonValueArray);
  if (this->m_arrayBuffer != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x438))(1,&this->m_arrayBuffer);
    this->m_arrayBuffer = 0;
  }
  deqp::gls::ShaderPerformanceCase::deinit((ShaderPerformanceCase *)this);
  return;
}

Assistant:

void ConditionalCase::deinit (void)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	m_comparisonValueArray.clear();

	if (m_arrayBuffer != 0)
	{
		gl.deleteBuffers(1, &m_arrayBuffer);
		m_arrayBuffer = 0;
	}

	ShaderPerformanceCase::deinit();
}